

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Linear_Object_State_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Linear_Object_State_PDU::Linear_Object_State_PDU
          (Linear_Object_State_PDU *this,EntityIdentifier *ObjID,EntityIdentifier *RefObjID,
          KUINT16 UpdateNum,ForceID FI,SimulationIdentifier *ReqID,SimulationIdentifier *RecvID,
          ObjectType *O,
          vector<KDIS::DATA_TYPE::LinearSegmentParameter,_std::allocator<KDIS::DATA_TYPE::LinearSegmentParameter>_>
          *Segments)

{
  SimulationIdentifier *ReqID_local;
  ForceID FI_local;
  KUINT16 UpdateNum_local;
  EntityIdentifier *RefObjID_local;
  EntityIdentifier *ObjID_local;
  Linear_Object_State_PDU *this_local;
  
  Object_State_Header::Object_State_Header
            (&this->super_Object_State_Header,ObjID,RefObjID,UpdateNum,FI);
  (this->super_Object_State_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Linear_Object_State_PDU_00503018;
  (this->super_Object_State_Header).field_0x4b = 0;
  DATA_TYPE::SimulationIdentifier::SimulationIdentifier(&this->m_ReqID,ReqID);
  DATA_TYPE::SimulationIdentifier::SimulationIdentifier(&this->m_RecvID,RecvID);
  DATA_TYPE::ObjectType::ObjectType(&this->m_ObjTyp,O);
  std::
  vector<KDIS::DATA_TYPE::LinearSegmentParameter,_std::allocator<KDIS::DATA_TYPE::LinearSegmentParameter>_>
  ::vector(&this->m_vSegments);
  (this->super_Object_State_Header).super_Header.super_Header6.m_ui8PDUType = ',';
  (this->super_Object_State_Header).super_Header.super_Header6.m_ui16PDULength = 0x28;
  SetLinearSegmentParameters(this,Segments);
  return;
}

Assistant:

Linear_Object_State_PDU::Linear_Object_State_PDU( const EntityIdentifier & ObjID, const EntityIdentifier & RefObjID , KUINT16 UpdateNum,
        ForceID FI, const SimulationIdentifier & ReqID, const SimulationIdentifier & RecvID,
        const ObjectType & O, std::vector<LinearSegmentParameter> & Segments ) :
    Object_State_Header( ObjID, RefObjID, UpdateNum, FI ),
    m_ReqID( ReqID ),
    m_RecvID( RecvID ),
    m_ObjTyp( O ),
    m_ui8NumSegment( 0 )
{
    m_ui8PDUType = LinearObjectState_PDU_Type;
    m_ui16PDULength = LINEAR_OBJECT_STATE_PDU_SIZE;
    SetLinearSegmentParameters( Segments );
}